

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentLowering.cpp
# Opt level: O1

Expression * __thiscall wasm::AlignmentLowering::lowerStoreI32(AlignmentLowering *this,Store *curr)

{
  ExpressionList *pEVar1;
  Name *pNVar2;
  ulong uVar3;
  address64_t aVar4;
  undefined1 auVar5 [16];
  Name memory;
  Id IVar6;
  Id index;
  Memory *pMVar7;
  Expression *pEVar8;
  Expression *pEVar9;
  Store *pSVar10;
  Const *pCVar11;
  Binary *pBVar12;
  uint align;
  uint bytes;
  Type in_R8;
  Address offset;
  size_t sVar13;
  char *pcVar14;
  initializer_list<wasm::Expression_*> local_90;
  LocalSet *local_80;
  LocalSet *local_78;
  Store *local_70;
  Const *local_68;
  string_view *local_60;
  ulong local_58;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *local_50;
  Address local_48;
  Id local_40;
  Id local_3c;
  Builder local_38;
  Builder builder;
  
  uVar3 = (curr->align).addr;
  if ((uVar3 != 0) && (uVar3 != curr->bytes)) {
    local_38.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
         ).super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>.
         super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>.
         currModule;
    if ((curr->value->type).id != 2) {
      __assert_fail("curr->value->type == Type::i32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/AlignmentLowering.cpp"
                    ,0x92,"Expression *wasm::AlignmentLowering::lowerStoreI32(Store *)");
    }
    pNVar2 = &curr->memory;
    pMVar7 = Module::getMemory(local_38.wasm,(Name)(curr->memory).super_IString.str);
    local_58 = (pMVar7->indexType).id;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_58;
    IVar6 = Builder::addVar((Builder *)
                            (this->
                            super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                            ).
                            super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                            .
                            super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                            .currFunction,(Function *)0x0,(Name)(auVar5 << 0x40),in_R8);
    index = Builder::addVar((Builder *)
                            (this->
                            super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                            ).
                            super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                            .
                            super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                            .currFunction,(Function *)0x0,(Name)(ZEXT816(2) << 0x40),in_R8);
    local_3c = IVar6;
    local_80 = Builder::makeLocalSet(&local_38,IVar6,curr->ptr);
    local_40 = index;
    local_78 = Builder::makeLocalSet(&local_38,index,curr->value);
    local_90._M_len = 2;
    local_90._M_array = (iterator)&local_80;
    local_70 = (Store *)Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                                  (&local_38,&local_90);
    local_60 = (string_view *)pNVar2;
    if (curr->bytes == '\x04') {
      aVar4 = (curr->align).addr;
      if (aVar4 == 2) {
        local_50 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                   &local_70->align;
        local_48.addr = (curr->offset).addr;
        pEVar8 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar8->_id = LocalGetId;
        pEVar8[1]._id = local_3c;
        (pEVar8->type).id = local_58;
        pEVar9 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar9->_id = LocalGetId;
        pEVar9[1]._id = local_40;
        (pEVar9->type).id = 2;
        pSVar10 = Builder::makeStore(&local_38,2,local_48,2,pEVar8,pEVar9,(Type)0x2,
                                     (Name)(pNVar2->super_IString).str);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (local_50,(Expression *)pSVar10);
        offset.addr = (curr->offset).addr + 2;
        pEVar8 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar8->_id = LocalGetId;
        pEVar8[1]._id = local_3c;
        (pEVar8->type).id = local_58;
        pEVar9 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar9->_id = LocalGetId;
        pEVar9[1]._id = local_40;
        (pEVar9->type).id = 2;
        pCVar11 = Builder::makeConst<int>(&local_38,0x10);
        pBVar12 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
        (pBVar12->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (pBVar12->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar12->op = ShrUInt32;
        pBVar12->left = pEVar9;
        pBVar12->right = (Expression *)pCVar11;
        Binary::finalize(pBVar12);
        sVar13 = ((string_view *)&local_60->_M_len)->_M_len;
        pcVar14 = local_60->_M_str;
        bytes = 2;
        align = 2;
      }
      else {
        if (aVar4 != 1) {
          handle_unreachable("invalid alignment",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/AlignmentLowering.cpp"
                             ,0xe9);
        }
        pEVar1 = (ExpressionList *)&local_70->align;
        local_48.addr = (curr->offset).addr;
        local_50 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)pEVar1;
        pEVar8 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar8->_id = LocalGetId;
        pEVar8[1]._id = local_3c;
        (pEVar8->type).id = local_58;
        pEVar9 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar9->_id = LocalGetId;
        pEVar9[1]._id = local_40;
        (pEVar9->type).id = 2;
        pSVar10 = Builder::makeStore(&local_38,1,local_48,1,pEVar8,pEVar9,(Type)0x2,
                                     (Name)(pNVar2->super_IString).str);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)pEVar1,
                   (Expression *)pSVar10);
        local_48.addr = (curr->offset).addr + 1;
        pEVar8 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar8->_id = LocalGetId;
        pEVar8[1]._id = local_3c;
        (pEVar8->type).id = local_58;
        pEVar9 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar9->_id = LocalGetId;
        pEVar9[1]._id = local_40;
        (pEVar9->type).id = 2;
        local_68 = Builder::makeConst<int>(&local_38,8);
        pBVar12 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
        (pBVar12->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (pBVar12->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar12->op = ShrUInt32;
        pBVar12->left = pEVar9;
        pBVar12->right = (Expression *)local_68;
        Binary::finalize(pBVar12);
        pSVar10 = Builder::makeStore(&local_38,1,local_48,1,pEVar8,(Expression *)pBVar12,(Type)0x2,
                                     (Name)*local_60);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (local_50,(Expression *)pSVar10);
        local_48.addr = (curr->offset).addr + 2;
        pEVar8 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar8->_id = LocalGetId;
        pEVar8[1]._id = local_3c;
        (pEVar8->type).id = local_58;
        pEVar9 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar9->_id = LocalGetId;
        pEVar9[1]._id = local_40;
        (pEVar9->type).id = 2;
        local_68 = Builder::makeConst<int>(&local_38,0x10);
        pBVar12 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
        (pBVar12->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (pBVar12->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar12->op = ShrUInt32;
        pBVar12->left = pEVar9;
        pBVar12->right = (Expression *)local_68;
        Binary::finalize(pBVar12);
        pSVar10 = Builder::makeStore(&local_38,1,local_48,1,pEVar8,(Expression *)pBVar12,(Type)0x2,
                                     (Name)*local_60);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (local_50,(Expression *)pSVar10);
        offset.addr = (curr->offset).addr + 3;
        pEVar8 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar8->_id = LocalGetId;
        pEVar8[1]._id = local_3c;
        (pEVar8->type).id = local_58;
        pEVar9 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar9->_id = LocalGetId;
        pEVar9[1]._id = local_40;
        (pEVar9->type).id = 2;
        pCVar11 = Builder::makeConst<int>(&local_38,0x18);
        pBVar12 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
        (pBVar12->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (pBVar12->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar12->op = ShrUInt32;
        pBVar12->left = pEVar9;
        pBVar12->right = (Expression *)pCVar11;
        Binary::finalize(pBVar12);
        sVar13 = ((string_view *)&local_60->_M_len)->_M_len;
        pcVar14 = local_60->_M_str;
        bytes = 1;
        align = 1;
      }
    }
    else {
      if (curr->bytes != '\x02') {
        handle_unreachable("invalid size",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/AlignmentLowering.cpp"
                           ,0xec);
      }
      pEVar1 = (ExpressionList *)&local_70->align;
      local_48.addr = (curr->offset).addr;
      local_50 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)pEVar1;
      pEVar8 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      pEVar8->_id = LocalGetId;
      pEVar8[1]._id = local_3c;
      (pEVar8->type).id = local_58;
      pEVar9 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      IVar6 = local_40;
      pEVar9->_id = LocalGetId;
      pEVar9[1]._id = local_40;
      (pEVar9->type).id = 2;
      pSVar10 = Builder::makeStore(&local_38,1,local_48,1,pEVar8,pEVar9,(Type)0x2,(Name)*local_60);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)pEVar1,
                 (Expression *)pSVar10);
      offset.addr = (curr->offset).addr + 1;
      pEVar8 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      pEVar8->_id = LocalGetId;
      pEVar8[1]._id = local_3c;
      (pEVar8->type).id = local_58;
      pEVar9 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      pEVar9->_id = LocalGetId;
      pEVar9[1]._id = IVar6;
      (pEVar9->type).id = 2;
      pCVar11 = Builder::makeConst<int>(&local_38,8);
      pBVar12 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
      (pBVar12->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (pBVar12->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      pBVar12->op = ShrUInt32;
      pBVar12->left = pEVar9;
      pBVar12->right = (Expression *)pCVar11;
      Binary::finalize(pBVar12);
      sVar13 = ((string_view *)&local_60->_M_len)->_M_len;
      pcVar14 = local_60->_M_str;
      bytes = 1;
      align = 1;
    }
    memory.super_IString.str._M_str = pcVar14;
    memory.super_IString.str._M_len = sVar13;
    pSVar10 = Builder::makeStore(&local_38,bytes,offset,align,pEVar8,(Expression *)pBVar12,(Type)0x2
                                 ,memory);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (local_50,(Expression *)pSVar10);
    curr = local_70;
    Block::finalize((Block *)local_70);
  }
  return (Expression *)curr;
}

Assistant:

Expression* lowerStoreI32(Store* curr) {
    if (curr->align == 0 || curr->align == curr->bytes) {
      return curr;
    }
    Builder builder(*getModule());
    assert(curr->value->type == Type::i32);
    auto mem = getModule()->getMemory(curr->memory);
    auto indexType = mem->indexType;
    auto tempPtr = builder.addVar(getFunction(), indexType);
    auto tempValue = builder.addVar(getFunction(), Type::i32);
    auto* block =
      builder.makeBlock({builder.makeLocalSet(tempPtr, curr->ptr),
                         builder.makeLocalSet(tempValue, curr->value)});
    if (curr->bytes == 2) {
      block->list.push_back(
        builder.makeStore(1,
                          curr->offset,
                          1,
                          builder.makeLocalGet(tempPtr, indexType),
                          builder.makeLocalGet(tempValue, Type::i32),
                          Type::i32,
                          curr->memory));
      block->list.push_back(builder.makeStore(
        1,
        curr->offset + 1,
        1,
        builder.makeLocalGet(tempPtr, indexType),
        builder.makeBinary(ShrUInt32,
                           builder.makeLocalGet(tempValue, Type::i32),
                           builder.makeConst(int32_t(8))),
        Type::i32,
        curr->memory));
    } else if (curr->bytes == 4) {
      if (curr->align == 1) {
        block->list.push_back(
          builder.makeStore(1,
                            curr->offset,
                            1,
                            builder.makeLocalGet(tempPtr, indexType),
                            builder.makeLocalGet(tempValue, Type::i32),
                            Type::i32,
                            curr->memory));
        block->list.push_back(builder.makeStore(
          1,
          curr->offset + 1,
          1,
          builder.makeLocalGet(tempPtr, indexType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(8))),
          Type::i32,
          curr->memory));
        block->list.push_back(builder.makeStore(
          1,
          curr->offset + 2,
          1,
          builder.makeLocalGet(tempPtr, indexType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(16))),
          Type::i32,
          curr->memory));
        block->list.push_back(builder.makeStore(
          1,
          curr->offset + 3,
          1,
          builder.makeLocalGet(tempPtr, indexType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(24))),
          Type::i32,
          curr->memory));
      } else if (curr->align == 2) {
        block->list.push_back(
          builder.makeStore(2,
                            curr->offset,
                            2,
                            builder.makeLocalGet(tempPtr, indexType),
                            builder.makeLocalGet(tempValue, Type::i32),
                            Type::i32,
                            curr->memory));
        block->list.push_back(builder.makeStore(
          2,
          curr->offset + 2,
          2,
          builder.makeLocalGet(tempPtr, indexType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(16))),
          Type::i32,
          curr->memory));
      } else {
        WASM_UNREACHABLE("invalid alignment");
      }
    } else {
      WASM_UNREACHABLE("invalid size");
    }
    block->finalize();
    return block;
  }